

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTSnapObjects.cpp
# Opt level: O1

void TTD::NSSnapObjects::EmitAddtlInfo_SnapES5ArrayInfo(SnapObject *snpObject,FileWriter *writer)

{
  uint32 *puVar1;
  long lVar2;
  ulong uVar3;
  long lVar4;
  
  if (snpObject->SnapObjectTag == SnapES5ArrayObject) {
    puVar1 = (uint32 *)snpObject->AddtlSnapObjectInfo;
    FileWriter::WriteLengthValue(writer,*puVar1,CommaSeparator);
    (*writer->_vptr_FileWriter[0xc])(writer,10,(ulong)(byte)puVar1[6]);
    FileWriter::WriteSequenceStart_DefaultKey(writer,CommaSeparator);
    if (*puVar1 != 0) {
      lVar4 = 0;
      uVar3 = 0;
      do {
        lVar2 = *(long *)(puVar1 + 2);
        (*writer->_vptr_FileWriter[6])(writer,(ulong)(lVar4 != 0));
        FileWriter::WriteUInt32(writer,index,*(uint32 *)(lVar2 + lVar4),NoSeparator);
        FileWriter::WriteUInt32
                  (writer,attributeFlags,(uint)*(byte *)(lVar2 + 4 + lVar4),CommaSeparator);
        (*writer->_vptr_FileWriter[3])(writer,0x15,1);
        NSSnapValues::EmitTTDVar(*(TTDVar *)(lVar2 + 8 + lVar4),writer,NoSeparator);
        (*writer->_vptr_FileWriter[3])(writer,0x16,1);
        NSSnapValues::EmitTTDVar(*(TTDVar *)(lVar2 + 0x10 + lVar4),writer,NoSeparator);
        (*writer->_vptr_FileWriter[7])(writer,0);
        uVar3 = uVar3 + 1;
        lVar4 = lVar4 + 0x18;
      } while (uVar3 < *puVar1);
    }
    (*writer->_vptr_FileWriter[5])(writer,0);
    EmitAddtlInfo_SnapArrayInfoCore<void*>(*(SnapArrayInfo<void_*> **)(puVar1 + 4),writer);
    return;
  }
  TTDAbort_unrecoverable_error("Tag does not match.");
}

Assistant:

void EmitAddtlInfo_SnapES5ArrayInfo(const SnapObject* snpObject, FileWriter* writer)
        {
            SnapES5ArrayInfo* es5Info = SnapObjectGetAddtlInfoAs<SnapES5ArrayInfo*, SnapObjectType::SnapES5ArrayObject>(snpObject);

            writer->WriteLengthValue(es5Info->GetterSetterCount, NSTokens::Separator::CommaSeparator);
            writer->WriteBool(NSTokens::Key::boolVal, es5Info->IsLengthWritable, NSTokens::Separator::CommaSeparator);

            writer->WriteSequenceStart_DefaultKey(NSTokens::Separator::CommaSeparator);
            for(uint32 i = 0; i < es5Info->GetterSetterCount; ++i)
            {
                NSTokens::Separator sep = (i != 0) ? NSTokens::Separator::CommaSeparator : NSTokens::Separator::NoSeparator;
                const SnapES5ArrayGetterSetterEntry* entry = es5Info->GetterSetterEntries + i;

                writer->WriteRecordStart(sep);

                writer->WriteUInt32(NSTokens::Key::index, entry->Index);
                writer->WriteUInt32(NSTokens::Key::attributeFlags, entry->Attributes, NSTokens::Separator::CommaSeparator);

                writer->WriteKey(NSTokens::Key::getterEntry, NSTokens::Separator::CommaSeparator);
                NSSnapValues::EmitTTDVar(entry->Getter, writer, NSTokens::Separator::NoSeparator);

                writer->WriteKey(NSTokens::Key::setterEntry, NSTokens::Separator::CommaSeparator);
                NSSnapValues::EmitTTDVar(entry->Setter, writer, NSTokens::Separator::NoSeparator);

                writer->WriteRecordEnd();
            }
            writer->WriteSequenceEnd();

            EmitAddtlInfo_SnapArrayInfoCore<TTDVar>(es5Info->BasicArrayData, writer);
        }